

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O2

void __thiscall cmXMLWriter::~cmXMLWriter(cmXMLWriter *this)

{
  if (this->Indent == 0) {
    std::__cxx11::string::~string((string *)&this->IndentationElement);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&(this->Elements).c);
    return;
  }
  __assert_fail("this->Indent == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmXMLWriter.cxx"
                ,0x12,"cmXMLWriter::~cmXMLWriter()");
}

Assistant:

cmXMLWriter::~cmXMLWriter()
{
  assert(this->Indent == 0);
}